

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

void file_free_register(_7zip_conflict *zip)

{
  file *pfVar1;
  file *file_next;
  file *file;
  _7zip_conflict *zip_local;
  
  file_next = (zip->file_list).first;
  while (file_next != (file *)0x0) {
    pfVar1 = file_next->next;
    file_free(file_next);
    file_next = pfVar1;
  }
  return;
}

Assistant:

static void
file_free_register(struct _7zip *zip)
{
	struct file *file, *file_next;

	file = zip->file_list.first;
	while (file != NULL) {
		file_next = file->next;
		file_free(file);
		file = file_next;
	}
}